

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O2

size_t trng::utility::
       discrete<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                 (double x,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (*first._M_current <= x) {
    sVar1 = 0;
    sVar4 = ((long)last._M_current - (long)first._M_current >> 3) - 1;
    while (sVar3 = sVar1, 1 < (long)(sVar4 - sVar3)) {
      sVar2 = (long)(sVar4 + sVar3) / 2;
      sVar1 = sVar2;
      if (x <= first._M_current[sVar2]) {
        sVar1 = sVar3;
        sVar4 = sVar2;
      }
    }
  }
  else {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

std::size_t discrete(double x, iter first, iter last) {
      using difference_type = typename std::iterator_traits<iter>::difference_type;
      if (x < (*first))
        return 0;
      difference_type i1{0}, i2{last - first - 1};
      while (i2 - i1 > difference_type(1)) {
        const difference_type i3{(i2 + i1) / 2};
        if (x <= first[i3])
          i2 = i3;
        else
          i1 = i3;
      }
      return static_cast<std::size_t>(i2);
    }